

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

long ps_config_int(cmd_ln_t *config,char *name)

{
  cmd_ln_val_t *pcVar1;
  void *pvVar2;
  
  pcVar1 = cmd_ln_access_r(config,name);
  if (pcVar1 == (cmd_ln_val_t *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else if ((pcVar1->type & 0x12) == 0) {
    pvVar2 = (void *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x23a,"Argument %s does not have integer type\n",name);
  }
  else {
    pvVar2 = (pcVar1->val).ptr;
  }
  return (long)pvVar2;
}

Assistant:

long
ps_config_int(cmd_ln_t *config, char const *name)
{
    cmd_ln_val_t *val;
    val = cmd_ln_access_r(config, name);
    if (val == NULL)
        return 0L;
    if (!(val->type & (ARG_INTEGER | ARG_BOOLEAN))) {
        E_ERROR("Argument %s does not have integer type\n", name);
        return 0L;
    }
    return val->val.i;
}